

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtw_stb_image.h
# Opt level: O3

void __thiscall rtw_image::convert_to_bytes(rtw_image *this)

{
  float fVar1;
  float *pfVar2;
  int iVar3;
  uchar *puVar4;
  int iVar5;
  long lVar6;
  uchar uVar7;
  
  iVar5 = this->image_height * this->image_width * this->bytes_per_pixel;
  iVar3 = -1;
  if (-1 < iVar5) {
    iVar3 = iVar5;
  }
  puVar4 = (uchar *)operator_new__((long)iVar3);
  this->bdata = puVar4;
  if (0 < iVar5) {
    pfVar2 = this->fdata;
    lVar6 = 0;
    do {
      fVar1 = pfVar2[lVar6];
      if (fVar1 <= 0.0) {
        uVar7 = '\0';
      }
      else {
        uVar7 = 0xff;
        if (fVar1 < 1.0) {
          uVar7 = (uchar)(int)(fVar1 * 256.0);
        }
      }
      puVar4[lVar6] = uVar7;
      lVar6 = lVar6 + 1;
    } while (iVar5 != (int)lVar6);
  }
  return;
}

Assistant:

void convert_to_bytes() {
        // Convert the linear floating point pixel data to bytes, storing the resulting byte
        // data in the `bdata` member.

        int total_bytes = image_width * image_height * bytes_per_pixel;
        bdata = new unsigned char[total_bytes];

        // Iterate through all pixel components, converting from [0.0, 1.0] float values to
        // unsigned [0, 255] byte values.

        auto *bptr = bdata;
        auto *fptr = fdata;
        for (auto i=0; i < total_bytes; i++, fptr++, bptr++)
            *bptr = float_to_byte(*fptr);
    }